

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat4 * dja::mat4::homogeneous::scale(mat4 *__return_storage_ptr__,vec3 *values)

{
  mat3 local_2c;
  
  local_2c.m[0].x = values->x;
  local_2c.m[1].y = values->y;
  local_2c.m[2].z = values->z;
  local_2c.m[0].y = 0.0;
  local_2c.m[0].z = 0.0;
  local_2c.m[1].x = 0.0;
  local_2c.m[1].z = 0.0;
  local_2c.m[2].x = 0.0;
  local_2c.m[2].y = 0.0;
  from_mat3(&local_2c);
  return __return_storage_ptr__;
}

Assistant:

mat3 mat3::scale(const vec3& values)
{
    return mat3(values[0], 0, 0,
                0, values[1], 0,
                0, 0, values[2]);
}